

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O2

int acutest_cmdline_callback_(int id,char *arg)

{
  acutest_test_data_ *paVar1;
  FILE *__stream;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  
  switch(id) {
  case 0x71:
    acutest_verbose_level_ = 0;
    break;
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
    break;
  case 0x76:
    if (arg == (char *)0x0) {
      acutest_verbose_level_ = acutest_verbose_level_ + 1;
    }
    else {
      acutest_verbose_level_ = atoi(arg);
    }
    break;
  case 0x77:
    acutest_worker_ = 1;
    acutest_worker_index_ = atoi(arg);
    break;
  case 0x78:
    acutest_xml_output_ = (FILE *)fopen(arg,"w");
    __stream = _stderr;
    if ((FILE *)acutest_xml_output_ != (FILE *)0x0) {
      return 0;
    }
    piVar3 = __errno_location();
    pcVar11 = strerror(*piVar3);
    fprintf(__stream,"Unable to open \'%s\': %s\n",arg,pcVar11);
    goto LAB_00103b48;
  default:
    switch(id) {
    case 99:
      if ((arg == (char *)0x0) || (iVar2 = strcmp(arg,"always"), iVar2 == 0)) {
        acutest_colorize_ = 1;
        return 0;
      }
      iVar2 = strcmp(arg,"never");
      if (iVar2 == 0) {
        acutest_colorize_ = 0;
        return 0;
      }
      iVar2 = strcmp(arg,"auto");
      if (iVar2 == 0) {
        return 0;
      }
      pcVar11 = "%s: Unrecognized argument \'%s\' for option --color.\n";
      break;
    case 100:
    case 0x66:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
      goto switchD_00103771_caseD_64;
    case 0x65:
      if ((arg == (char *)0x0) || (iVar2 = strcmp(arg,"always"), iVar2 == 0)) {
        acutest_no_exec_ = 0;
        return 0;
      }
      iVar2 = strcmp(arg,"never");
      if (iVar2 == 0) {
        acutest_no_exec_ = 1;
        return 0;
      }
      iVar2 = strcmp(arg,"auto");
      if (iVar2 == 0) {
        return 0;
      }
      pcVar11 = "%s: Unrecognized argument \'%s\' for option --exec.\n";
      break;
    case 0x68:
      acutest_help_();
      goto LAB_00103afb;
    case 0x6c:
      acutest_list_names_();
LAB_00103afb:
      acutest_exit_(0);
    default:
      if (id != 0) {
        if (id == 0x43) {
          acutest_colorize_ = 0;
          return 0;
        }
        if (id == 0x45) {
          acutest_no_exec_ = 1;
          return 0;
        }
        if (id == 0x53) {
          acutest_no_summary_ = 1;
          return 0;
        }
        if (id == 0x54) {
          acutest_tap_ = 1;
          return 0;
        }
        if (id == 0x58) {
          acutest_exclude_mode_ = 1;
          return 0;
        }
        if (id == -0x7fffffff) {
          pcVar11 = "Unrecognized command line option \'%s\'.\n";
        }
        else if (id == -0x7ffffffe) {
          pcVar11 = "The command line option \'%s\' requires an argument.\n";
        }
        else {
          if (id != -0x7ffffffd) {
            return 0;
          }
          pcVar11 = "The command line option \'%s\' does not expect an argument.\n";
        }
        fprintf(_stderr,pcVar11,arg);
        goto LAB_00103b30;
      }
      uVar4 = (ulong)(uint)acutest_list_size_;
      if (acutest_list_size_ < 1) {
        uVar4 = 0;
      }
      uVar9 = 0;
      while (uVar8 = uVar9, paVar1 = acutest_test_data_, uVar4 * 0x10 + 0x10 != uVar8 + 0x10) {
        iVar2 = strcmp(*(char **)((long)&acutest_list_[0].name + uVar8),arg);
        uVar9 = uVar8 + 0x10;
        if (iVar2 == 0) {
          *(undefined4 *)((long)&acutest_test_data_->state + uVar8) = 0xfffffffd;
          return 0;
        }
      }
      iVar2 = 0;
      for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
        pcVar11 = acutest_list_[uVar9].name;
        sVar5 = strlen(arg);
        pcVar6 = pcVar11;
        do {
          pcVar6 = strstr(pcVar6,arg);
          if (pcVar6 == (char *)0x0) goto LAB_00103a4e;
          bVar13 = true;
          bVar12 = true;
          if (pcVar6 != pcVar11) {
            pvVar7 = memchr(acutest_name_contains_word__word_delim,(int)pcVar6[-1],10);
            bVar12 = pvVar7 != (void *)0x0;
          }
          if (pcVar6[sVar5] != '\0') {
            pvVar7 = memchr(acutest_name_contains_word__word_delim,(int)pcVar6[sVar5],10);
            bVar13 = pvVar7 != (void *)0x0;
          }
          pcVar6 = pcVar6 + 1;
        } while (!(bool)(bVar12 & bVar13));
        paVar1[uVar9].state = ACUTEST_STATE_SELECTED;
        iVar2 = iVar2 + 1;
LAB_00103a4e:
      }
      if (0 < iVar2) {
        return 0;
      }
      for (lVar10 = 0; uVar4 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
        pcVar11 = strstr(*(char **)((long)&acutest_list_[0].name + lVar10),arg);
        if (pcVar11 != (char *)0x0) {
          *(undefined4 *)((long)&paVar1->state + lVar10) = 0xfffffffd;
          iVar2 = iVar2 + 1;
        }
      }
      if (iVar2 != 0) {
        return 0;
      }
      fprintf(_stderr,"%s: Unrecognized unit test \'%s\'\n",acutest_argv0_,arg);
      pcVar11 = "Try \'%s --list\' for list of unit tests.\n";
      goto LAB_00103b41;
    }
    fprintf(_stderr,pcVar11,acutest_argv0_,arg);
LAB_00103b30:
    pcVar11 = "Try \'%s --help\' for more information.\n";
LAB_00103b41:
    fprintf(_stderr,pcVar11,acutest_argv0_);
LAB_00103b48:
    acutest_exit_(2);
  }
switchD_00103771_caseD_64:
  return 0;
}

Assistant:

static int
acutest_cmdline_callback_(int id, const char* arg)
{
    switch(id) {
        case 'X':
            acutest_exclude_mode_ = 1;
            break;

        case 'e':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                acutest_no_exec_ = 0;
            } else if(strcmp(arg, "never") == 0) {
                acutest_no_exec_ = 1;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --exec.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case 'E':
            acutest_no_exec_ = 1;
            break;

        case 't':
#if defined ACUTEST_WIN_  ||  defined ACUTEST_HAS_POSIX_TIMER_
            if(arg == NULL || strcmp(arg, "real") == 0) {
                acutest_timer_ = 1;
    #ifndef ACUTEST_WIN_
            } else if(strcmp(arg, "cpu") == 0) {
                acutest_timer_ = 2;
    #endif
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --time.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
#endif
            break;

        case 'S':
            acutest_no_summary_ = 1;
            break;

        case 'T':
            acutest_tap_ = 1;
            break;

        case 'l':
            acutest_list_names_();
            acutest_exit_(0);
            break;

        case 'v':
            acutest_verbose_level_ = (arg != NULL ? atoi(arg) : acutest_verbose_level_+1);
            break;

        case 'q':
            acutest_verbose_level_ = 0;
            break;

        case 'c':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                acutest_colorize_ = 1;
            } else if(strcmp(arg, "never") == 0) {
                acutest_colorize_ = 0;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --color.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case 'C':
            acutest_colorize_ = 0;
            break;

        case 'h':
            acutest_help_();
            acutest_exit_(0);
            break;

        case 'w':
            acutest_worker_ = 1;
            acutest_worker_index_ = atoi(arg);
            break;
        case 'x':
            acutest_xml_output_ = fopen(arg, "w");
            if (!acutest_xml_output_) {
                fprintf(stderr, "Unable to open '%s': %s\n", arg, strerror(errno));
                acutest_exit_(2);
            }
            break;

        case 0:
            if(acutest_select_(arg) == 0) {
                fprintf(stderr, "%s: Unrecognized unit test '%s'\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --list' for list of unit tests.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case ACUTEST_CMDLINE_OPTID_UNKNOWN_:
            fprintf(stderr, "Unrecognized command line option '%s'.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;

        case ACUTEST_CMDLINE_OPTID_MISSINGARG_:
            fprintf(stderr, "The command line option '%s' requires an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;

        case ACUTEST_CMDLINE_OPTID_BOGUSARG_:
            fprintf(stderr, "The command line option '%s' does not expect an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;
    }

    return 0;
}